

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::IndianCalendar::handleComputeMonthStart
          (IndianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int32_t iVar1;
  int iVar2;
  uint year;
  int iVar3;
  double dVar4;
  double dVar5;
  int32_t local_1c;
  double local_18;
  
  local_1c = month;
  if (0xb < (uint)month) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&local_1c);
    eyear = eyear + iVar1;
  }
  iVar3 = 1;
  if (local_1c != 0xc) {
    iVar3 = local_1c + 1;
  }
  year = eyear + 0x4e;
  if ((year & 3) == 0) {
    local_18 = 31.0;
    iVar1 = 0x15;
    if (((year * -0x3d70a3d7 + 0x51eb850 >> 2 | year * 0x40000000) < 0x28f5c29) &&
       (year != ((int)year / 400) * 400)) goto LAB_002628da;
  }
  else {
LAB_002628da:
    local_18 = 30.0;
    iVar1 = 0x16;
  }
  dVar4 = gregorianToJD(year,3,iVar1);
  if (iVar3 == 1) {
    dVar5 = 0.0;
  }
  else {
    iVar2 = 7;
    if (iVar3 < 7) {
      iVar2 = iVar3;
    }
    dVar4 = (double)(iVar2 * 0x1f + -0x3e) + local_18 + dVar4;
    if (iVar3 < 8) goto LAB_00262955;
    dVar5 = (double)(iVar3 * 0x1e + -0xd2);
  }
  dVar4 = dVar4 + dVar5;
LAB_00262955:
  return (int)dVar4;
}

Assistant:

int32_t IndianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /* useMonth */ ) const {

   //month is 0 based; converting it to 1-based 
   int32_t imonth;

    // If the month is out of range, adjust it into range, and adjust the extended eyar accordingly
   if (month < 0 || month > 11) {
      eyear += (int32_t)ClockMath::floorDivide(month, 12, month);
   }

   if(month == 12){
       imonth = 1;
   } else {
       imonth = month + 1; 
   }
   
   double jd = IndianToJD(eyear ,imonth, 1);

   return (int32_t)jd;
}